

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void Process::Private::splitCommandLine(String *commandLine,List<String> *command)

{
  char cVar1;
  char *pcVar2;
  String arg;
  
  arg.data = &String::emptyData.super_Data;
  pcVar2 = String::operator_cast_to_char_(commandLine);
LAB_00109fba:
  do {
    cVar1 = *pcVar2;
    if (cVar1 != ' ') {
      if (cVar1 == '\"') {
        pcVar2 = pcVar2 + 1;
LAB_00109fdf:
        do {
          cVar1 = *pcVar2;
          do {
            if (cVar1 != '\\') {
              if (cVar1 == '\0') goto LAB_00109fba;
              if (cVar1 == '\"') goto LAB_0010a02b;
              pcVar2 = pcVar2 + 1;
              String::append(&arg,cVar1);
              goto LAB_00109fdf;
            }
          } while (pcVar2[1] != '\"');
          String::append(&arg,'\"');
          pcVar2 = pcVar2 + 2;
        } while( true );
      }
      if (cVar1 == '\0') {
        if ((arg.data)->len != 0) {
          List<String>::append(command,&arg);
        }
        String::~String(&arg);
        return;
      }
      pcVar2 = pcVar2 + 1;
      String::append(&arg,cVar1);
      goto LAB_00109fba;
    }
    List<String>::append(command,&arg);
    String::clear(&arg);
LAB_0010a02b:
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

static void splitCommandLine(const String& commandLine, List<String>& command)
  {
    String arg;
    for (const char* p = commandLine; *p;)
      switch (*p)
      {
      case '"':
        for (++p; *p;)
        {
          switch (*p)
          {
          case '"':
            ++p;
            break;
          case '\\':
            if (p[1] == '"')
            {
              arg.append('"');
              p += 2;
            }
            continue;
          default:
            arg.append(*(p++));
            continue;
          }
          break;
        }
        break;
      case ' ':
        command.append(arg);
        arg.clear();
        ++p;
        break;
      default:
        arg.append(*(p++));
      }
    if (!arg.isEmpty())
      command.append(arg);
  }